

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_GeometryShop.H
# Opt level: O0

void __thiscall
amrex::EB2::
GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
::getIntercept_Cpu(GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,_amrex::EB2::CylinderIF>,_int>
                   *this,Array4<double> *inter,Array4<const_unsigned_int> *type,Geometry *geom,
                  Box *bounding_box,int idim)

{
  CoordSys *in_RCX;
  anon_class_64_8_f246ecda *in_RDI;
  undefined8 *in_R8;
  Box bx;
  Dim3 bhi;
  Dim3 blo;
  GpuArray<double,_3U> *problo;
  GpuArray<double,_3U> *dx;
  Array4<double> *a;
  Box *this_00;
  Geometry *in_stack_fffffffffffffe50;
  Box *in_stack_fffffffffffffe90;
  undefined1 local_110 [32];
  undefined1 local_f0 [80];
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 *local_28;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  a = (Array4<double> *)local_f0;
  local_f0._40_8_ = in_R8;
  CoordSys::CellSizeArray((GpuArray<double,_3U> *)a,in_RCX);
  this_00 = (Box *)local_110;
  local_f0._24_8_ = a;
  Geometry::ProbLoArray(in_stack_fffffffffffffe50);
  local_90 = (undefined8 *)local_f0._40_8_;
  local_58 = (undefined8 *)local_f0._40_8_;
  local_5c = 0;
  local_88 = *(undefined4 *)local_f0._40_8_;
  local_68 = (undefined8 *)local_f0._40_8_;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(local_f0._40_8_ + 4);
  local_a0 = *(undefined8 *)local_f0._40_8_;
  local_78 = (undefined8 *)local_f0._40_8_;
  local_7c = 2;
  local_98 = *(undefined4 *)(local_f0._40_8_ + 8);
  local_40 = (undefined8 *)local_f0._40_8_;
  local_8 = (undefined8 *)(local_f0._40_8_ + 0xc);
  local_c = 0;
  local_38 = *(undefined4 *)local_8;
  local_18 = (undefined4 *)(local_f0._40_8_ + 0xc);
  local_1c = 1;
  uStack_34 = *(undefined4 *)(local_f0._40_8_ + 0x10);
  local_50 = *local_8;
  local_28 = (undefined4 *)(local_f0._40_8_ + 0xc);
  local_2c = 2;
  local_48 = *(undefined4 *)(local_f0._40_8_ + 0x14);
  local_110._24_8_ = this_00;
  local_80 = local_98;
  local_30 = local_48;
  Box::Box<double>(this_00,a);
  LoopOnCpu<amrex::EB2::GeometryShop<amrex::EB2::UnionIF<amrex::EB2::LatheIF<amrex::EB2::SplineIF>,amrex::EB2::CylinderIF>,int>::getIntercept_Cpu(amrex::Array4<double>const&,amrex::Array4<unsigned_int_const>const&,amrex::Geometry_const&,amrex::Box_const&,int)const::_lambda(int,int,int)_1_>
            (in_stack_fffffffffffffe90,in_RDI);
  return;
}

Assistant:

void getIntercept_Cpu (Array4<Real> const& inter,
                           Array4<Type_t const> const& type,
                           Geometry const& geom,
                           Box const& bounding_box,
                           const int idim) const noexcept
    {
        auto const& dx = geom.CellSizeArray();
        auto const& problo = geom.ProbLoArray();
        const auto blo = amrex::lbound(bounding_box);
        const auto bhi = amrex::ubound(bounding_box);
        const Box bx{inter};
        amrex::LoopOnCpu(bx, [&] (int i, int j, int k) noexcept
        {
            if (type(i,j,k) == Type::irregular) {
                IntVect ivlo(AMREX_D_DECL(i,j,k));
                IntVect ivhi(AMREX_D_DECL(i,j,k));
                ivhi[idim] += 1;
                inter(i,j,k) = BrentRootFinder
                    ({AMREX_D_DECL(problo[0]+amrex::Clamp(ivlo[0],blo.x,bhi.x)*dx[0],
                                   problo[1]+amrex::Clamp(ivlo[1],blo.y,bhi.y)*dx[1],
                                   problo[2]+amrex::Clamp(ivlo[2],blo.z,bhi.z)*dx[2])},
                     {AMREX_D_DECL(problo[0]+amrex::Clamp(ivhi[0],blo.x,bhi.x)*dx[0],
                                   problo[1]+amrex::Clamp(ivhi[1],blo.y,bhi.y)*dx[1],
                                   problo[2]+amrex::Clamp(ivhi[2],blo.z,bhi.z)*dx[2])},
                     idim, m_f);
            } else {
                inter(i,j,k) = std::numeric_limits<Real>::quiet_NaN();
            }
        });
    }